

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O1

void * vdpp_map_buffer_with_fd(int fd,size_t bufSize)

{
  void *pvVar1;
  
  if (fd < 1) {
    pvVar1 = (void *)0x0;
    _mpp_log_l(2,(char *)0x0,"failed to mmap buffer with fd! invalid fd value %d input!\n",
               "vdpp_map_buffer_with_fd",fd);
  }
  else {
    pvVar1 = mmap((void *)0x0,bufSize,3,1,fd,0);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      pvVar1 = (void *)0x0;
      _mpp_log_l(2,(char *)0x0,"failed to mmap buffer, fd=%d, size=%zu\n","vdpp_map_buffer_with_fd",
                 fd,bufSize);
    }
  }
  return pvVar1;
}

Assistant:

static void* vdpp_map_buffer_with_fd(int fd, size_t bufSize)
{
    void* ptr = NULL;

    if (fd > 0) {
        ptr = mmap(NULL, bufSize, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
        if (ptr == MAP_FAILED) {
            mpp_err_f("failed to mmap buffer, fd=%d, size=%zu\n", fd, bufSize);
            return NULL;
        }
    } else {
        mpp_err_f("failed to mmap buffer with fd! invalid fd value %d input!\n", fd);
    }

    return ptr;
}